

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,char *pathname)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int t;
  long lVar5;
  char menupath [1024];
  char itempath [1024];
  
  lVar4 = 0;
  memset(menupath,0,0x400);
  lVar5 = 0;
  do {
    iVar2 = size(this);
    if (iVar2 <= lVar5) {
      return -1;
    }
    pFVar1 = this->menu_;
    if ((*(byte *)((long)&pFVar1->flags + lVar4) & 0x40) == 0) {
      if (*(long *)((long)&pFVar1->text + lVar4) != 0) {
        strcpy(itempath,menupath);
        if (itempath[0] != '\0') {
          fl_strlcat(itempath,"/",0x400);
        }
        fl_strlcat(itempath,*(char **)((long)&pFVar1->text + lVar4),0x400);
        pcVar3 = itempath;
        goto LAB_00187589;
      }
      pcVar3 = strrchr(menupath,0x2f);
      if (pcVar3 == (char *)0x0) {
        menupath[0] = '\0';
      }
      else {
        *pcVar3 = '\0';
      }
    }
    else {
      if (menupath[0] != '\0') {
        fl_strlcat(menupath,"/",0x400);
      }
      fl_strlcat(menupath,*(char **)((long)&pFVar1->text + lVar4),0x400);
      pcVar3 = menupath;
LAB_00187589:
      iVar2 = strcmp(pcVar3,pathname);
      if (iVar2 == 0) {
        return (int)lVar5;
      }
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x38;
  } while( true );
}

Assistant:

int Fl_Menu_::find_index(const char *pathname) const {
  char menupath[1024] = "";	// File/Export
  for ( int t=0; t < size(); t++ ) {
    Fl_Menu_Item *m = menu_ + t;
    if (m->flags&FL_SUBMENU) {
      // IT'S A SUBMENU
      // we do not support searches through FL_SUBMENU_POINTER links
      if (menupath[0]) strlcat(menupath, "/", sizeof(menupath));
      strlcat(menupath, m->label(), sizeof(menupath));
      if (!strcmp(menupath, pathname)) return(t);
    } else {
      if (!m->label()) {
	// END OF SUBMENU? Pop back one level.
	char *ss = strrchr(menupath, '/');
	if ( ss ) *ss = 0;
	else menupath[0] = '\0';
	continue;
      }
      // IT'S A MENU ITEM
      char itempath[1024];	// eg. Edit/Copy
      strcpy(itempath, menupath);
      if (itempath[0]) strlcat(itempath, "/", sizeof(itempath));
      strlcat(itempath, m->label(), sizeof(itempath));
      if (!strcmp(itempath, pathname)) return(t);
    }
  }
  return(-1);
}